

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

void __thiscall
glcts::ArraysOfArrays::ExpressionsIndexingScalar3<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ExpressionsIndexingScalar3<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  TestError *this_00;
  int sub_script_index;
  int iVar1;
  int iVar2;
  string base_shader_string;
  string shader_source;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  base_shader_string._M_dataplus._M_p = (pointer)&base_shader_string.field_2;
  base_shader_string._M_string_length = 0;
  base_shader_string.field_2._M_local_buf[0] = '\0';
  shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
  shader_source._M_string_length = 0;
  shader_source.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)&base_shader_string);
  std::__cxx11::string::append((char *)&base_shader_string);
  std::__cxx11::string::append((string *)&base_shader_string);
  iVar2 = 0;
  while( true ) {
    if (iVar2 == 0x10) {
      std::__cxx11::string::~string((string *)&shader_source);
      std::__cxx11::string::~string((string *)&base_shader_string);
      return;
    }
    std::operator+(&local_50,&base_shader_string,"    a");
    std::__cxx11::string::operator=((string *)&shader_source,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    for (iVar1 = 3; -1 < iVar1; iVar1 = iVar1 + -1) {
      std::__cxx11::string::append((char *)&shader_source);
    }
    std::__cxx11::string::append((char *)&shader_source);
    if (iVar2 != 0xf) break;
    iVar2 = 0x10;
  }
  if (tested_shader_type < SHADER_TYPE_LAST) {
    (*(code *)(&DAT_01722b94 + *(int *)(&DAT_01722b94 + (ulong)tested_shader_type * 4)))();
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Unrecognized shader type.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0xc1e);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ExpressionsIndexingScalar3<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string base_shader_string;
	std::string shader_source;
	const int   test_array_dimensions = 4;

	base_shader_string = "float a[1][2][3][4];\n";
	base_shader_string += "float b = 2.0;\n\n";
	base_shader_string += shader_start;

	for (int permutation = 0; permutation < (1 << test_array_dimensions); permutation++)
	{
		shader_source = base_shader_string + "    a";

		for (int sub_script_index = test_array_dimensions - 1; sub_script_index >= 0; sub_script_index--)
		{
			if (permutation & (1 << sub_script_index))
			{
				shader_source += "[0]";
			}
			else
			{
				shader_source += "[4]";
			}
		}

		shader_source += " = b;\n";

		if (permutation != (1 << test_array_dimensions) - 1)
		{
			/* End main */
			DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

			/* Execute test */
			this->execute_negative_test(tested_shader_type, shader_source);
		} /* if (permutation != (1 << test_array_dimensions) - 1) */
	}	 /* for (int permutation = 0; ...) */
}